

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b2070 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b2077._0_1_ = '-';
    uRam00000000001b2077._1_1_ = '-';
    uRam00000000001b2077._2_1_ = '-';
    uRam00000000001b2077._3_1_ = '-';
    uRam00000000001b2077._4_1_ = '-';
    uRam00000000001b2077._5_1_ = '-';
    uRam00000000001b2077._6_1_ = '-';
    uRam00000000001b2077._7_1_ = '-';
    DAT_001b2060 = '-';
    DAT_001b2060_1._0_1_ = '-';
    DAT_001b2060_1._1_1_ = '-';
    DAT_001b2060_1._2_1_ = '-';
    DAT_001b2060_1._3_1_ = '-';
    DAT_001b2060_1._4_1_ = '-';
    DAT_001b2060_1._5_1_ = '-';
    DAT_001b2060_1._6_1_ = '-';
    uRam00000000001b2068 = 0x2d2d2d2d2d2d2d;
    DAT_001b206f = 0x2d;
    DAT_001b2050 = '-';
    DAT_001b2050_1._0_1_ = '-';
    DAT_001b2050_1._1_1_ = '-';
    DAT_001b2050_1._2_1_ = '-';
    DAT_001b2050_1._3_1_ = '-';
    DAT_001b2050_1._4_1_ = '-';
    DAT_001b2050_1._5_1_ = '-';
    DAT_001b2050_1._6_1_ = '-';
    uRam00000000001b2058._0_1_ = '-';
    uRam00000000001b2058._1_1_ = '-';
    uRam00000000001b2058._2_1_ = '-';
    uRam00000000001b2058._3_1_ = '-';
    uRam00000000001b2058._4_1_ = '-';
    uRam00000000001b2058._5_1_ = '-';
    uRam00000000001b2058._6_1_ = '-';
    uRam00000000001b2058._7_1_ = '-';
    DAT_001b2040 = '-';
    DAT_001b2040_1._0_1_ = '-';
    DAT_001b2040_1._1_1_ = '-';
    DAT_001b2040_1._2_1_ = '-';
    DAT_001b2040_1._3_1_ = '-';
    DAT_001b2040_1._4_1_ = '-';
    DAT_001b2040_1._5_1_ = '-';
    DAT_001b2040_1._6_1_ = '-';
    uRam00000000001b2048._0_1_ = '-';
    uRam00000000001b2048._1_1_ = '-';
    uRam00000000001b2048._2_1_ = '-';
    uRam00000000001b2048._3_1_ = '-';
    uRam00000000001b2048._4_1_ = '-';
    uRam00000000001b2048._5_1_ = '-';
    uRam00000000001b2048._6_1_ = '-';
    uRam00000000001b2048._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001b2038._0_1_ = '-';
    uRam00000000001b2038._1_1_ = '-';
    uRam00000000001b2038._2_1_ = '-';
    uRam00000000001b2038._3_1_ = '-';
    uRam00000000001b2038._4_1_ = '-';
    uRam00000000001b2038._5_1_ = '-';
    uRam00000000001b2038._6_1_ = '-';
    uRam00000000001b2038._7_1_ = '-';
    DAT_001b207f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}